

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

void __thiscall TRM::VertexList::append(VertexList *this,VertexList *other)

{
  VertexList *other_local;
  VertexList *this_local;
  
  if ((other->super_LinkedList<TRM::Vertex>).head != (Vertex *)0x0) {
    if ((this->super_LinkedList<TRM::Vertex>).tail == (Vertex *)0x0) {
      (this->super_LinkedList<TRM::Vertex>).head = (other->super_LinkedList<TRM::Vertex>).head;
    }
    else {
      ((this->super_LinkedList<TRM::Vertex>).tail)->next =
           (other->super_LinkedList<TRM::Vertex>).head;
      ((other->super_LinkedList<TRM::Vertex>).head)->prev =
           (this->super_LinkedList<TRM::Vertex>).tail;
    }
    (this->super_LinkedList<TRM::Vertex>).tail = (other->super_LinkedList<TRM::Vertex>).tail;
  }
  return;
}

Assistant:

void VertexList::append(VertexList const& other) {
  if (other.head == nullptr) {
    return;
  }

  if (tail) {
    tail->next = other.head;
    other.head->prev = tail;
  } else {
    head = other.head;
  }

  tail = other.tail;
}